

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

SQInteger __thiscall
SQString::Next(SQString *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQObjectPtr *this_00;
  SQObjectPtr *in_RSI;
  long in_RDI;
  SQInteger idx;
  byte *local_8;
  
  this_00 = (SQObjectPtr *)TranslateIndex(in_RSI);
  if ((long)this_00 < *(long *)(in_RDI + 0x28)) {
    ::SQObjectPtr::operator=(this_00,in_RDI);
    ::SQObjectPtr::operator=(this_00,in_RDI);
    local_8 = (byte *)((long)&(this_00->super_SQObject)._type + 1);
  }
  else {
    local_8 = (byte *)0xffffffffffffffff;
  }
  return (SQInteger)local_8;
}

Assistant:

SQInteger SQString::Next(const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQInteger idx = (SQInteger)TranslateIndex(refpos);
    while(idx < _len){
        outkey = (SQInteger)idx;
        outval = (SQInteger)((SQUnsignedInteger)_val[idx]);
        //return idx for the next iteration
        return ++idx;
    }
    //nothing to iterate anymore
    return -1;
}